

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

uint32_t mjs::index_value_from_string(wstring_view *str)

{
  wchar_t *pwVar1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  sVar2 = str->_M_len;
  if (sVar2 - 0xb < 0xfffffffffffffff6) {
    if (sVar2 == 0) {
      __assert_fail("len",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/string.cpp"
                    ,0x27,"uint32_t mjs::index_value_from_string(const std::wstring_view &)");
    }
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      if ((uint)sVar2 <= (uint)lVar4) {
        return uVar3;
      }
      pwVar1 = str->_M_str + lVar4;
      if (9 < (uint)(*pwVar1 + L'\xffffffd0')) {
        return 0xffffffff;
      }
      lVar4 = lVar4 + 1;
      uVar5 = (*pwVar1 + uVar3 * 10) - 0x30;
      bVar6 = uVar3 <= uVar5;
      uVar3 = uVar5;
    } while (bVar6);
  }
  return 0xffffffff;
}

Assistant:

uint32_t index_value_from_string(const std::wstring_view& str) {
    const auto len = str.length();
    if (len == 0 || len > 10) {
        assert(len); // Shouldn't be passed the empty string
        return invalid_index_value;
    }
    uint32_t index = 0;
    for (uint32_t i = 0; i < len; ++i) {
        const auto ch = str[i];
        if (ch < L'0' || ch > L'9') {
            return invalid_index_value;
        }
        const auto last = index;
        index = index*10 + (ch - L'0');
        if (index < last) {
            // Overflow
            return invalid_index_value;
        }
    }
    return index;
}